

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
::set_presets(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
              *this,jpegls_pc_parameters *presets,uint32_t restart_interval)

{
  uint32_t restart_interval_local;
  jpegls_pc_parameters *presets_local;
  jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
  *this_local;
  
  initialize_parameters
            (this,presets->threshold1,presets->threshold2,presets->threshold3,presets->reset_value);
  this->restart_interval_ = restart_interval;
  return;
}

Assistant:

void set_presets(const jpegls_pc_parameters& presets, const uint32_t restart_interval) override
    {
        initialize_parameters(presets.threshold1, presets.threshold2, presets.threshold3, presets.reset_value);
        restart_interval_ = restart_interval;
    }